

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

void __thiscall
t_rs_generator::render_thrift_error
          (t_rs_generator *this,string *error_kind,string *error_struct,string *sub_error_kind,
          string *error_message)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  ostream *poVar3;
  string sStack_58;
  string *local_38;
  
  poVar1 = &this->f_gen_;
  local_38 = error_message;
  t_generator::indent_abi_cxx11_(&sStack_58,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&sStack_58);
  poVar3 = std::operator<<(poVar3,"Err(");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_58);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&sStack_58,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&sStack_58);
  poVar3 = std::operator<<(poVar3,"thrift::Error::");
  poVar3 = std::operator<<(poVar3,(string *)error_kind);
  poVar3 = std::operator<<(poVar3,"(");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_58);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + 1;
  render_thrift_error_struct(this,error_struct,sub_error_kind,local_38);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&sStack_58,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&sStack_58);
  poVar3 = std::operator<<(poVar3,")");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_58);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&sStack_58,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&sStack_58);
  poVar3 = std::operator<<(poVar3,")");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_58);
  return;
}

Assistant:

void t_rs_generator::render_thrift_error(
  const string& error_kind,
  const string& error_struct,
  const string& sub_error_kind,
  const string& error_message
) {
  f_gen_ << indent() << "Err(" << endl;
  indent_up();
  f_gen_ << indent() << "thrift::Error::" << error_kind << "(" << endl;
  indent_up();
  render_thrift_error_struct(error_struct, sub_error_kind, error_message);
  indent_down();
  f_gen_ << indent() << ")" << endl;
  indent_down();
  f_gen_ << indent() << ")" << endl;
}